

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

int Sfm_DecCombineDec(Sfm_Dec_t *p,word *pTruth0,word *pTruth1,int *pSupp0,int *pSupp1,int nSupp0,
                     int nSupp1,word *pTruth,int *pSupp,int Var)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  word **ppwVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  int *piVar14;
  word *pwVar15;
  
  uVar8 = 1 << ((char)nSupp0 - 6U & 0x1f);
  if (nSupp0 < 7) {
    uVar8 = 1;
  }
  if (nSupp0 == nSupp1) {
    __n = (long)nSupp0 * 4;
    iVar4 = bcmp(pSupp0,pSupp1,__n);
    if (iVar4 == 0) {
      lVar5 = (long)(int)uVar8;
      iVar4 = bcmp(pTruth0,pTruth1,lVar5 * 8);
      if (iVar4 == 0) {
        memcpy(pSupp,pSupp0,__n);
        memcpy(pTruth,pTruth0,lVar5 * 8);
        iVar4 = p->pPars->nVarMax;
        if (iVar4 == nSupp0) {
          return nSupp0;
        }
        if (iVar4 <= nSupp0) goto LAB_004b672f;
        uVar9 = 1 << ((char)iVar4 - 6U & 0x1f);
        if (iVar4 < 7) {
          uVar9 = 1;
        }
        if (uVar8 == uVar9) {
          return nSupp0;
        }
        if ((int)uVar8 < (int)uVar9) {
          if ((int)uVar9 < 1) {
            return nSupp0;
          }
          lVar11 = 0;
          pwVar15 = pTruth;
          do {
            if (0 < (int)uVar8) {
              uVar13 = 0;
              do {
                pwVar15[uVar13] = pTruth[uVar13];
                uVar13 = uVar13 + 1;
              } while (uVar8 != uVar13);
            }
            lVar11 = lVar11 + lVar5;
            pwVar15 = pwVar15 + lVar5;
          } while (lVar11 < (long)(ulong)uVar9);
          return nSupp0;
        }
        goto LAB_004b676d;
      }
    }
  }
  piVar6 = pSupp1;
  piVar12 = pSupp;
  piVar14 = pSupp0;
  if (0 < nSupp1 && 0 < nSupp0) {
    do {
      iVar4 = *piVar14;
      iVar1 = *piVar6;
      if (iVar4 == iVar1) {
        piVar14 = piVar14 + 1;
        *piVar12 = iVar4;
        piVar6 = piVar6 + 1;
      }
      else if (iVar4 < iVar1) {
        piVar14 = piVar14 + 1;
        *piVar12 = iVar4;
      }
      else {
        piVar6 = piVar6 + 1;
        *piVar12 = iVar1;
      }
      piVar12 = piVar12 + 1;
    } while ((piVar14 < pSupp0 + nSupp0) && (piVar6 < pSupp1 + nSupp1));
  }
  for (; piVar14 < pSupp0 + nSupp0; piVar14 = piVar14 + 1) {
    *piVar12 = *piVar14;
    piVar12 = piVar12 + 1;
  }
  for (; piVar6 < pSupp1 + nSupp1; piVar6 = piVar6 + 1) {
    *piVar12 = *piVar6;
    piVar12 = piVar12 + 1;
  }
  uVar13 = (ulong)((long)piVar12 - (long)pSupp) >> 2;
  iVar4 = (int)uVar13;
  if (0x10 < iVar4) {
    __assert_fail("vArr->nSize <= vArr->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x6ec,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (iVar4 < nSupp0) {
    __assert_fail("vArr->nSize >= vArr1->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x6ed,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (iVar4 < nSupp1) {
    __assert_fail("vArr->nSize >= vArr2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x6ee,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (iVar4 == 0x10) {
    if (pSupp == (int *)0x0) {
      piVar6 = (int *)malloc(0x80);
    }
    else {
      piVar6 = (int *)realloc(pSupp,0x80);
    }
    uVar10 = 0x11;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
LAB_004b63b3:
    uVar13 = uVar13 & 0xffffffff;
    do {
      if (piVar6[uVar13 - 1] <= Var) goto LAB_004b63d1;
      piVar6[uVar13] = piVar6[uVar13 - 1];
      bVar2 = 1 < uVar13;
      uVar13 = uVar13 - 1;
    } while (bVar2);
    uVar13 = 0;
  }
  else {
    uVar10 = (ulong)(iVar4 + 1);
    piVar6 = pSupp;
    if (0 < iVar4) goto LAB_004b63b3;
  }
LAB_004b63d1:
  piVar6[(int)uVar13] = Var;
  iVar4 = (int)uVar10;
  if (p->pPars->nVarMax < iVar4) {
    return -2;
  }
  cVar3 = (char)uVar10;
  if (iVar4 != nSupp0) {
    if (iVar4 <= nSupp0) goto LAB_004b672f;
    uVar9 = 1 << (cVar3 - 6U & 0x1f);
    if (iVar4 < 7) {
      uVar9 = 1;
    }
    if (uVar8 != uVar9) {
      if ((int)uVar9 <= (int)uVar8) goto LAB_004b676d;
      if (0 < (int)uVar9) {
        lVar5 = 0;
        pwVar15 = pTruth0;
        do {
          if (0 < (int)uVar8) {
            uVar13 = 0;
            do {
              pwVar15[uVar13] = pTruth0[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar8 != uVar13);
          }
          lVar5 = lVar5 + (int)uVar8;
          pwVar15 = pwVar15 + (int)uVar8;
        } while (lVar5 < (long)(ulong)uVar9);
      }
    }
  }
  if (iVar4 != nSupp1) {
    if (iVar4 <= nSupp1) goto LAB_004b672f;
    uVar8 = 1 << ((char)nSupp1 - 6U & 0x1f);
    if (nSupp1 < 7) {
      uVar8 = 1;
    }
    uVar9 = 1 << (cVar3 - 6U & 0x1f);
    if (iVar4 < 7) {
      uVar9 = 1;
    }
    if (uVar8 != uVar9) {
      if ((int)uVar9 <= (int)uVar8) goto LAB_004b676d;
      if (0 < (int)uVar9) {
        lVar5 = 0;
        pwVar15 = pTruth1;
        do {
          if (0 < (int)uVar8) {
            uVar13 = 0;
            do {
              pwVar15[uVar13] = pTruth1[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar8 != uVar13);
          }
          lVar5 = lVar5 + (int)uVar8;
          pwVar15 = pwVar15 + (int)uVar8;
        } while (lVar5 < (long)(ulong)uVar9);
      }
    }
  }
  Abc_TtExpand(pTruth0,iVar4,pSupp0,nSupp0,pSupp,iVar4);
  Abc_TtExpand(pTruth1,iVar4,pSupp1,nSupp1,pSupp,iVar4);
  if (iVar4 < 1) {
    ppwVar7 = (word **)(p->TtElems[7] + 3);
    uVar8 = 1;
LAB_004b6583:
    pwVar15 = *ppwVar7;
    uVar13 = 0;
    do {
      pTruth[uVar13] = (pTruth1[uVar13] ^ pTruth0[uVar13]) & pwVar15[uVar13] ^ pTruth0[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar8 != uVar13);
    bVar2 = true;
    uVar9 = uVar8;
  }
  else {
    uVar13 = 0;
    do {
      if (piVar6[uVar13] == Var) goto LAB_004b654b;
      uVar13 = uVar13 + 1;
    } while (uVar10 != uVar13);
    uVar13 = 0xffffffffffffffff;
LAB_004b654b:
    uVar9 = 1 << (cVar3 - 6U & 0x1f);
    uVar8 = 1;
    if (6 < iVar4) {
      uVar8 = uVar9;
    }
    if (0 < (int)uVar8) {
      ppwVar7 = p->pTtElems + uVar13;
      goto LAB_004b6583;
    }
    bVar2 = false;
  }
  iVar1 = p->pPars->nVarMax;
  if (iVar4 != iVar1) {
    if (iVar1 <= iVar4) {
LAB_004b672f:
      __assert_fail("nVarS < nVarB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                    ,0x301,"void Abc_TtStretch6(word *, int, int)");
    }
    uVar8 = 1 << ((char)iVar1 - 6U & 0x1f);
    if (iVar1 < 7) {
      uVar8 = 1;
    }
    if (uVar9 != uVar8) {
      if ((int)uVar8 <= (int)uVar9) {
LAB_004b676d:
        __assert_fail("step < nWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                      ,0x306,"void Abc_TtStretch6(word *, int, int)");
      }
      if (0 < (int)uVar8) {
        lVar5 = 0;
        pwVar15 = pTruth;
        do {
          if (bVar2) {
            uVar13 = 0;
            do {
              pwVar15[uVar13] = pTruth[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar9 != uVar13);
          }
          lVar5 = lVar5 + (int)uVar9;
          pwVar15 = pwVar15 + (int)uVar9;
        } while (lVar5 < (long)(ulong)uVar8);
      }
    }
  }
  return iVar4;
}

Assistant:

int Sfm_DecCombineDec( Sfm_Dec_t * p, word * pTruth0, word * pTruth1, int * pSupp0, int * pSupp1, int nSupp0, int nSupp1, word * pTruth, int * pSupp, int Var )
{
    Vec_Int_t vVec0 = { 2*SFM_SUPP_MAX, nSupp0, pSupp0 };
    Vec_Int_t vVec1 = { 2*SFM_SUPP_MAX, nSupp1, pSupp1 };
    Vec_Int_t vVec  = { 2*SFM_SUPP_MAX, 0,      pSupp  };
    int nWords0 = Abc_TtWordNum(nSupp0);
    int nSupp, iSuppVar;
    // check the case of equal cofactors
    if ( nSupp0 == nSupp1 && !memcmp(pSupp0, pSupp1, sizeof(int)*nSupp0) && !memcmp(pTruth0, pTruth1, sizeof(word)*nWords0) )
    {
        memcpy( pSupp,  pSupp0,  sizeof(int)*nSupp0   );
        memcpy( pTruth, pTruth0, sizeof(word)*nWords0 );
        Abc_TtStretch6( pTruth, nSupp0, p->pPars->nVarMax );
        return nSupp0;
    }
    // merge support variables
    Vec_IntTwoMerge2Int( &vVec0, &vVec1, &vVec );
    Vec_IntPushOrder( &vVec, Var );
    nSupp = Vec_IntSize( &vVec );
    if ( nSupp > p->pPars->nVarMax )
        return -2;
    // expand truth tables
    Abc_TtStretch6( pTruth0, nSupp0, nSupp );
    Abc_TtStretch6( pTruth1, nSupp1, nSupp );
    Abc_TtExpand( pTruth0, nSupp, pSupp0, nSupp0, pSupp, nSupp );
    Abc_TtExpand( pTruth1, nSupp, pSupp1, nSupp1, pSupp, nSupp );
    // perform operation
    iSuppVar = Vec_IntFind( &vVec, Var );
    Abc_TtMux( pTruth, p->pTtElems[iSuppVar], pTruth1, pTruth0, Abc_TtWordNum(nSupp) );
    Abc_TtStretch6( pTruth, nSupp, p->pPars->nVarMax );
    return nSupp;
}